

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_match.c
# Opt level: O2

int do_callout(heapframe *F,match_block_8 *mb,size_t *lengthptr)

{
  size_t *psVar1;
  _func_int_pcre2_callout_block_8_ptr_void_ptr *p_Var2;
  pcre2_callout_block_8 *ppVar3;
  size_t sVar4;
  int iVar5;
  PCRE2_SPTR8 pPVar6;
  ulong uVar7;
  size_t sVar8;
  
  pPVar6 = F->ecode;
  if (*pPVar6 == 'v') {
    uVar7 = 6;
  }
  else {
    uVar7 = (ulong)(ushort)(*(ushort *)(pPVar6 + 5) << 8 | *(ushort *)(pPVar6 + 5) >> 8);
  }
  *lengthptr = uVar7;
  p_Var2 = mb->callout;
  if (p_Var2 != (_func_int_pcre2_callout_block_8_ptr_void_ptr *)0x0) {
    psVar1 = &F->last_group_offset;
    ppVar3 = mb->cb;
    ppVar3->capture_top = ((uint)F->offset_top >> 1) + 1;
    ppVar3->capture_last = F->capture_last;
    ppVar3->offset_vector = psVar1;
    ppVar3->mark = mb->nomatch_mark;
    ppVar3->current_position = (long)F->eptr - (long)mb->start_subject;
    ppVar3->pattern_position =
         (ulong)(ushort)(*(ushort *)(pPVar6 + 1) << 8 | *(ushort *)(pPVar6 + 1) >> 8);
    ppVar3->next_item_length =
         (ulong)(ushort)(*(ushort *)(pPVar6 + 3) << 8 | *(ushort *)(pPVar6 + 3) >> 8);
    if (*pPVar6 == 'v') {
      ppVar3->callout_number = (uint)pPVar6[5];
      ppVar3->callout_string_offset = 0;
      pPVar6 = (PCRE2_SPTR8)0x0;
      sVar8 = 0;
    }
    else {
      ppVar3->callout_number = 0;
      ppVar3->callout_string_offset =
           (ulong)(ushort)(*(ushort *)(pPVar6 + 7) << 8 | *(ushort *)(pPVar6 + 7) >> 8);
      pPVar6 = pPVar6 + 10;
      sVar8 = *lengthptr - 0xb;
    }
    ppVar3->callout_string = pPVar6;
    ppVar3->callout_string_length = sVar8;
    sVar8 = *psVar1;
    sVar4 = F->offset_top;
    *(undefined4 *)psVar1 = 0xffffffff;
    *(undefined4 *)((long)&F->last_group_offset + 4) = 0xffffffff;
    *(undefined4 *)&F->offset_top = 0xffffffff;
    *(undefined4 *)((long)&F->offset_top + 4) = 0xffffffff;
    iVar5 = (*p_Var2)(ppVar3,mb->callout_data);
    *psVar1 = sVar8;
    F->offset_top = sVar4;
    ppVar3->callout_flags = 0;
    return iVar5;
  }
  return 0;
}

Assistant:

static int
do_callout(heapframe *F, match_block *mb, PCRE2_SIZE *lengthptr)
{
int rc;
PCRE2_SIZE save0, save1;
PCRE2_SIZE *callout_ovector;
pcre2_callout_block *cb;

*lengthptr = (*Fecode == OP_CALLOUT)?
  PRIV(OP_lengths)[OP_CALLOUT] : GET(Fecode, 1 + 2*LINK_SIZE);

if (mb->callout == NULL) return 0;   /* No callout function provided */

/* The original matching code (pre 10.30) worked directly with the ovector
passed by the user, and this was passed to callouts. Now that the working
ovector is in the backtracking frame, it no longer needs to reserve space for
the overall match offsets (which would waste space in the frame). For backward
compatibility, however, we pass capture_top and offset_vector to the callout as
if for the extended ovector, and we ensure that the first two slots are unset
by preserving and restoring their current contents. Picky compilers complain if
references such as Fovector[-2] are use directly, so we set up a separate
pointer. */

callout_ovector = (PCRE2_SIZE *)(Fovector) - 2;

/* The cb->version, cb->subject, cb->subject_length, and cb->start_match fields
are set externally. The first 3 never change; the last is updated for each
bumpalong. */

cb = mb->cb;
cb->capture_top      = (uint32_t)Foffset_top/2 + 1;
cb->capture_last     = Fcapture_last;
cb->offset_vector    = callout_ovector;
cb->mark             = mb->nomatch_mark;
cb->current_position = (PCRE2_SIZE)(Feptr - mb->start_subject);
cb->pattern_position = GET(Fecode, 1);
cb->next_item_length = GET(Fecode, 1 + LINK_SIZE);

if (*Fecode == OP_CALLOUT)  /* Numerical callout */
  {
  cb->callout_number = Fecode[1 + 2*LINK_SIZE];
  cb->callout_string_offset = 0;
  cb->callout_string = NULL;
  cb->callout_string_length = 0;
  }
else  /* String callout */
  {
  cb->callout_number = 0;
  cb->callout_string_offset = GET(Fecode, 1 + 3*LINK_SIZE);
  cb->callout_string = Fecode + (1 + 4*LINK_SIZE) + 1;
  cb->callout_string_length =
    *lengthptr - (1 + 4*LINK_SIZE) - 2;
  }

save0 = callout_ovector[0];
save1 = callout_ovector[1];
callout_ovector[0] = callout_ovector[1] = PCRE2_UNSET;
rc = mb->callout(cb, mb->callout_data);
callout_ovector[0] = save0;
callout_ovector[1] = save1;
cb->callout_flags = 0;
return rc;
}